

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O1

EverCrypt_DRBG_state_s * EverCrypt_DRBG_create_in(Spec_Hash_Definitions_hash_alg a)

{
  EverCrypt_DRBG_state_s *pEVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint32_t *puVar4;
  state_s_tags sVar5;
  undefined7 in_register_00000039;
  ulong uVar6;
  
  uVar6 = (ulong)((int)CONCAT71(in_register_00000039,a) - 1);
  switch(uVar6) {
  case 0:
    puVar2 = (uint8_t *)calloc(0x20,1);
    puVar3 = (uint8_t *)calloc(0x20,1);
    sVar5 = '\x01';
    break;
  case 1:
    puVar2 = (uint8_t *)calloc(0x30,1);
    puVar3 = (uint8_t *)calloc(0x30,1);
    sVar5 = '\x02';
    break;
  case 2:
    puVar2 = (uint8_t *)calloc(0x40,1);
    puVar3 = (uint8_t *)calloc(0x40,1);
    sVar5 = '\x03';
    break;
  case 3:
    puVar2 = (uint8_t *)calloc(0x14,1);
    puVar3 = (uint8_t *)calloc(0x14,1);
    sVar5 = '\0';
    break;
  default:
    EverCrypt_DRBG_create_in_cold_1();
    pEVar1 = EverCrypt_DRBG_create_in((Spec_Hash_Definitions_hash_alg)uVar6);
    return pEVar1;
  }
  puVar4 = (uint32_t *)malloc(4);
  *puVar4 = 1;
  pEVar1 = (EverCrypt_DRBG_state_s *)malloc(0x20);
  pEVar1->tag = sVar5;
  (pEVar1->field_1).case_SHA1_s.k = puVar2;
  (pEVar1->field_1).case_SHA1_s.v = puVar3;
  (pEVar1->field_1).case_SHA1_s.reseed_counter = puVar4;
  return pEVar1;
}

Assistant:

EverCrypt_DRBG_state_s *EverCrypt_DRBG_create_in(Spec_Hash_Definitions_hash_alg a)
{
  EverCrypt_DRBG_state_s st;
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(20U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(20U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA1_s,
              { .case_SHA1_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(32U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(32U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_256_s,
              { .case_SHA2_256_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(48U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(48U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_384_s,
              { .case_SHA2_384_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(64U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(64U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_512_s,
              { .case_SHA2_512_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  EverCrypt_DRBG_state_s
  *buf = (EverCrypt_DRBG_state_s *)KRML_HOST_MALLOC(sizeof (EverCrypt_DRBG_state_s));
  buf[0U] = st;
  return buf;
}